

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O0

int MOJOSHADER_internal_include_open
              (MOJOSHADER_includeType inctype,char *fname,char *parent,char **outdata,uint *outbytes
              ,MOJOSHADER_malloc m,MOJOSHADER_free f,void *d)

{
  int iVar1;
  char *__buf;
  __dev_t _Var2;
  int fd;
  char *data;
  stat statbuf;
  MOJOSHADER_malloc m_local;
  uint *outbytes_local;
  char **outdata_local;
  char *parent_local;
  char *fname_local;
  MOJOSHADER_includeType inctype_local;
  
  statbuf.__glibc_reserved[2] = (__syscall_slong_t)m;
  iVar1 = stat(fname,(stat *)&data);
  if (iVar1 == -1) {
    fname_local._4_4_ = 0;
  }
  else {
    __buf = (char *)(*(code *)statbuf.__glibc_reserved[2])(statbuf.st_rdev & 0xffffffff);
    if (__buf == (char *)0x0) {
      fname_local._4_4_ = 0;
    }
    else {
      iVar1 = open(fname,0);
      if (iVar1 == -1) {
        (*f)(__buf,d);
        fname_local._4_4_ = 0;
      }
      else {
        _Var2 = read(iVar1,__buf,statbuf.st_rdev);
        if (_Var2 == statbuf.st_rdev) {
          close(iVar1);
          *outdata = __buf;
          *outbytes = (uint)statbuf.st_rdev;
          fname_local._4_4_ = 1;
        }
        else {
          (*f)(__buf,d);
          close(iVar1);
          fname_local._4_4_ = 0;
        }
      }
    }
  }
  return fname_local._4_4_;
}

Assistant:

int MOJOSHADER_internal_include_open(MOJOSHADER_includeType inctype,
                                     const char *fname, const char *parent,
                                     const char **outdata,
                                     unsigned int *outbytes,
                                     MOJOSHADER_malloc m, MOJOSHADER_free f,
                                     void *d)
{
#ifdef _MSC_VER
    WCHAR wpath[MAX_PATH];
    if (!MultiByteToWideChar(CP_UTF8, 0, fname, -1, wpath, MAX_PATH))
        return 0;

    const DWORD share = FILE_SHARE_READ | FILE_SHARE_WRITE | FILE_SHARE_DELETE;
    const HANDLE handle = CreateFileW(wpath, FILE_GENERIC_READ, share,
                                      NULL, OPEN_EXISTING, NULL, NULL);
    if (handle == INVALID_HANDLE_VALUE)
        return 0;

    const DWORD fileSize = GetFileSize(handle, NULL);
    if (fileSize == INVALID_FILE_SIZE)
    {
        CloseHandle(handle);
        return 0;
    } // if

    char *data = (char *) m(fileSize, d);
    if (data == NULL)
    {
        CloseHandle(handle);
        return 0;
    } // if

    DWORD readLength = 0;
    if (!ReadFile(handle, data, fileSize, &readLength, NULL))
    {
        CloseHandle(handle);
        f(data, d);
        return 0;
    } // if

    CloseHandle(handle);

    if (readLength != fileSize)
    {
        f(data, d);
        return 0;
    } // if
    *outdata = data;
    *outbytes = fileSize;
    return 1;
#else
    struct stat statbuf;
    if (stat(fname, &statbuf) == -1)
        return 0;
    char *data = (char *) m(statbuf.st_size, d);
    if (data == NULL)
        return 0;
    const int fd = open(fname, O_RDONLY);
    if (fd == -1)
    {
        f(data, d);
        return 0;
    } // if
    if (read(fd, data, statbuf.st_size) != statbuf.st_size)
    {
        f(data, d);
        close(fd);
        return 0;
    } // if
    close(fd);
    *outdata = data;
    *outbytes = (unsigned int) statbuf.st_size;
    return 1;
#endif
}